

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solstack.c
# Opt level: O0

void stk_InitFull(SolStack_t *stackPtr)

{
  undefined4 local_18;
  undefined4 local_14;
  ECardType_t ct;
  ECardColor_t cc;
  SolStack_t *stackPtr_local;
  
  if (stackPtr != (SolStack_t *)0x0) {
    stk_InitEmpty(stackPtr);
    for (local_14 = CC_SPADES; local_14 < NUM_CARD_COLORS; local_14 = local_14 + CC_HEARTS) {
      for (local_18 = CT_ACE; local_18 < NUM_CARD_TYPES; local_18 = local_18 + CT_ACE) {
        PushNew(stackPtr,local_14,local_18);
      }
    }
    Shuffle(stackPtr);
  }
  return;
}

Assistant:

void stk_InitFull(SolStack_t* stackPtr)
{
  if (stackPtr) {
    stk_InitEmpty(stackPtr);
    // fill the stack with all combinations of color and type
    for (ECardColor_t cc = CC_SPADES; cc <= CC_DIAMONDS; cc++) {
      for (ECardType_t ct = CT_ACE; ct <= CT_KING; ct++) {
        PushNew(stackPtr, cc, ct);
      }
    }

    Shuffle(stackPtr);
  }
}